

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

void xmlDebugDumpDocumentHead(FILE *output,xmlDocPtr doc)

{
  undefined1 local_b8 [8];
  xmlDebugCtxt ctxt;
  xmlDocPtr doc_local;
  FILE *output_local;
  
  doc_local = (xmlDocPtr)output;
  if (output == (FILE *)0x0) {
    doc_local = _stdout;
  }
  ctxt._152_8_ = doc;
  xmlCtxtDumpInitCtxt((xmlDebugCtxtPtr)local_b8);
  ctxt.errors = ctxt.errors | 1;
  local_b8 = (undefined1  [8])doc_local;
  xmlCtxtDumpDocumentHead((xmlDebugCtxtPtr)local_b8,(xmlDocPtr)ctxt._152_8_);
  xmlCtxtDumpCleanCtxt((xmlDebugCtxtPtr)local_b8);
  return;
}

Assistant:

void
xmlDebugDumpDocumentHead(FILE * output, xmlDocPtr doc)
{
    xmlDebugCtxt ctxt;

    if (output == NULL)
	output = stdout;
    xmlCtxtDumpInitCtxt(&ctxt);
    ctxt.options |= DUMP_TEXT_TYPE;
    ctxt.output = output;
    xmlCtxtDumpDocumentHead(&ctxt, doc);
    xmlCtxtDumpCleanCtxt(&ctxt);
}